

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O1

void __thiscall argo::unparser::unparse_object(unparser *this,json *j,int indent_level)

{
  type tVar1;
  writer *pwVar2;
  json_object *pjVar3;
  _Base_ptr p_Var4;
  int iVar5;
  size_t sVar6;
  allocator local_7e;
  allocator local_7d;
  int local_7c;
  string local_78;
  string local_58;
  _Rb_tree_node_base *local_38;
  
  local_7c = indent_level;
  print_indent(this,indent_level);
  pwVar2 = operator<<(this->m_writer,'{');
  std::__cxx11::string::string((string *)&local_78,this->m_space,&local_7d);
  pwVar2 = operator<<(pwVar2,&local_78);
  std::__cxx11::string::string((string *)&local_58,this->m_newline,&local_7e);
  operator<<(pwVar2,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  pjVar3 = json::get_object_abi_cxx11_(j);
  sVar6 = (pjVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  pjVar3 = json::get_object_abi_cxx11_(j);
  p_Var4 = (pjVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(pjVar3->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var4 != local_38) {
    do {
      print_indent(this,this->m_indent_inc + local_7c);
      pwVar2 = operator<<(this->m_writer,'\"');
      pwVar2 = operator<<(pwVar2,(string *)(p_Var4 + 1));
      pwVar2 = operator<<(pwVar2,'\"');
      std::__cxx11::string::string((string *)&local_78,this->m_space,&local_7d);
      pwVar2 = operator<<(pwVar2,&local_78);
      pwVar2 = operator<<(pwVar2,':');
      std::__cxx11::string::string((string *)&local_58,this->m_space,&local_7e);
      operator<<(pwVar2,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      tVar1 = json::get_instance_type(*(json **)(p_Var4 + 2));
      if (tVar1 == object_e) {
LAB_0011afc2:
        pwVar2 = this->m_writer;
        std::__cxx11::string::string((string *)&local_78,this->m_newline,(allocator *)&local_58);
        operator<<(pwVar2,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        iVar5 = this->m_indent_inc * 2;
      }
      else {
        tVar1 = json::get_instance_type(*(json **)(p_Var4 + 2));
        if (tVar1 == array_e) goto LAB_0011afc2;
        iVar5 = this->m_indent_inc;
      }
      unparse(this,*(json **)(p_Var4 + 2),iVar5 + local_7c);
      if (1 < (int)sVar6) {
        operator<<(this->m_writer,',');
      }
      pwVar2 = this->m_writer;
      std::__cxx11::string::string((string *)&local_78,this->m_newline,(allocator *)&local_58);
      operator<<(pwVar2,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      sVar6 = (size_t)((int)sVar6 - 1);
    } while (p_Var4 != local_38);
  }
  print_indent(this,local_7c);
  pwVar2 = this->m_writer;
  std::__cxx11::string::string((string *)&local_78,this->m_space,(allocator *)&local_58);
  pwVar2 = operator<<(pwVar2,&local_78);
  operator<<(pwVar2,'}');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

void unparser::unparse_object(const json &j, int indent_level)
{
    print_indent(indent_level);
    m_writer << '{' << m_space << m_newline;
    int n = j.get_object().size();
    for (const auto &p : j.get_object())
    {
        print_indent(indent_level + m_indent_inc);
        m_writer << '"' << p.first << '"' << m_space << ':' << m_space;
        if (p.second->get_instance_type() == json::object_e ||
            p.second->get_instance_type() == json::array_e)
        {
            m_writer << m_newline;
            unparse(*(p.second), indent_level + (m_indent_inc * 2));
        }
        else
        {
            unparse(*(p.second), indent_level + m_indent_inc);
        }
        if (n-- > 1)
        {
            m_writer << ',';
        }
        m_writer << m_newline;
    }
    print_indent(indent_level);
    m_writer << m_space << '}';
}